

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* Corrade::Utility::String::split
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *string,char delimiter)

{
  Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
  parts;
  BasicStringView<const_char> BStack_48;
  Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
  local_38;
  
  Containers::BasicStringView<char_const>::
  BasicStringView<std::__cxx11::string_const&,Corrade::Containers::BasicStringView<char_const>>
            ((BasicStringView<char_const> *)&BStack_48,string);
  Containers::BasicStringView<const_char>::split(&local_38,&BStack_48,delimiter);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<Corrade::Containers::BasicStringView<char_const>*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,local_38._data,local_38._data + local_38._size,
             (allocator_type *)&BStack_48);
  Containers::
  Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
  ::~Array(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> split(const std::string& string, const char delimiter) {
    /* IDGAF that this has one extra allocation due to the Array being copied
       to a std::vector, the owning std::string instances are much worse */
    Containers::Array<Containers::StringView> parts = Containers::StringView{string}.split(delimiter);
    return std::vector<std::string>{parts.begin(), parts.end()};
}